

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f278::
ARTOOMTest_Node48ShrinkToNode16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_Node48ShrinkToNode16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTOOMTest_Node48ShrinkToNode16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  (anonymous_namespace)::
  oom_remove_test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,(anonymous_namespace)::ARTOOMTest_Node48ShrinkToNode16_Test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda(unodb::test::tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>&)_1_,(anonymous_namespace)::ARTOOMTest_Node48ShrinkToNode16_Test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda(unodb::test::tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>&)_2_>
            (2,0x85);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node48ShrinkToNode16) {
  oom_remove_test<TypeParam>(
      2,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(0x80, 17);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({17, 0, 0, 1, 0});
        verifier.assert_shrinking_inodes({0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      },
      0x85,
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_shrinking_inodes({0, 0, 1, 0});
        verifier.assert_node_counts({16, 0, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      });
}